

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O2

void __thiscall
Commodore::Vic20::ConcreteMachine::set_key_state(ConcreteMachine *this,uint16_t key,bool is_pressed)

{
  byte bVar1;
  element_type *peVar2;
  byte bVar3;
  byte bVar4;
  
  if (key < 0xfff0) {
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    bVar3 = (byte)(key >> 3);
    bVar1 = peVar2->columns_[key & 7];
    bVar4 = bVar1 | bVar3;
    if (is_pressed) {
      bVar4 = ~bVar3 & bVar1;
    }
    peVar2->columns_[key & 7] = bVar4;
    return;
  }
  switch(key) {
  case 0xfff0:
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed * '\x02' | peVar2->columns_[3] & 0xfd;
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed << 7 | peVar2->columns_[3] & 0x7f;
    return;
  case 0xfff1:
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed * '\x02' | peVar2->columns_[3] & 0xfd;
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[2] = !is_pressed << 7 | peVar2->columns_[2] & 0x7f;
    return;
  case 0xfff2:
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed * '\x02' | peVar2->columns_[3] & 0xfd;
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[4] = !is_pressed << 7 | peVar2->columns_[4] & 0x7f;
    return;
  case 0xfff3:
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed * '\x02' | peVar2->columns_[3] & 0xfd;
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[5] = !is_pressed << 7 | peVar2->columns_[5] & 0x7f;
    return;
  case 0xfff4:
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed * '\x02' | peVar2->columns_[3] & 0xfd;
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[6] = !is_pressed << 7 | peVar2->columns_[6] & 0x7f;
    return;
  case 0xfff5:
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[3] = !is_pressed * '\x02' | peVar2->columns_[3] & 0xfd;
    peVar2 = (this->keyboard_via_port_handler_).
             super___shared_ptr<Commodore::Vic20::KeyboardVIA,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar2->columns_[7] = !is_pressed << 7 | peVar2->columns_[7] & 0x7f;
    break;
  case 0xfffd:
    MOS::MOS6522::MOS6522<Commodore::Vic20::UserPortVIA>::set_control_line_input
              (&this->user_port_via_,A,One,!is_pressed);
    return;
  }
  return;
}

Assistant:

void set_key_state(uint16_t key, bool is_pressed) final {
			if(key < 0xfff0) {
				keyboard_via_port_handler_->set_key_state(key, is_pressed);
			} else {
				switch(key) {
					case KeyRestore:
						user_port_via_.set_control_line_input(MOS::MOS6522::Port::A, MOS::MOS6522::Line::One, !is_pressed);
					break;
#define ShiftedMap(source, target)	\
					case source:	\
						keyboard_via_port_handler_->set_key_state(KeyLShift, is_pressed);	\
						keyboard_via_port_handler_->set_key_state(target, is_pressed);	\
					break;

					ShiftedMap(KeyUp, KeyDown);
					ShiftedMap(KeyLeft, KeyRight);
					ShiftedMap(KeyF2, KeyF1);
					ShiftedMap(KeyF4, KeyF3);
					ShiftedMap(KeyF6, KeyF5);
					ShiftedMap(KeyF8, KeyF7);
#undef ShiftedMap
				}
			}
		}